

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<arg_res_tuple<long_double,_2UL>_> *
Catch::Generators::
makeGenerators<arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>>
          (arg_res_tuple<long_double,_2UL> *val,arg_res_tuple<long_double,_2UL> *moreGenerators,
          arg_res_tuple<long_double,_2UL> *moreGenerators_1,
          arg_res_tuple<long_double,_2UL> *moreGenerators_2,
          arg_res_tuple<long_double,_2UL> *moreGenerators_3,
          arg_res_tuple<long_double,_2UL> *moreGenerators_4,
          arg_res_tuple<long_double,_2UL> *moreGenerators_5)

{
  arg_res_tuple<long_double,_2UL> *in_RDI;
  arg_res_tuple<long_double,_2UL> *in_R8;
  arg_res_tuple<long_double,_2UL> *in_R9;
  arg_res_tuple<long_double,_2UL> *in_stack_ffffffffffffff98;
  arg_res_tuple<long_double,_2UL> *moreGenerators_1_00;
  arg_res_tuple<long_double,_2UL> *moreGenerators_00;
  GeneratorWrapper<arg_res_tuple<long_double,_2UL>_> *in_stack_ffffffffffffffb8;
  arg_res_tuple<long_double,_2UL> *in_stack_ffffffffffffffc8;
  
  moreGenerators_00 = (arg_res_tuple<long_double,_2UL> *)&stack0xffffffffffffffc8;
  moreGenerators_1_00 = in_RDI;
  value<arg_res_tuple<long_double,2ul>>(in_stack_ffffffffffffffc8);
  makeGenerators<arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>>
            (in_stack_ffffffffffffffb8,moreGenerators_00,moreGenerators_1_00,in_RDI,
             in_stack_ffffffffffffff98,in_R9,in_R8);
  GeneratorWrapper<arg_res_tuple<long_double,_2UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<long_double,_2UL>_> *)0x3f1ecc);
  return (Generators<arg_res_tuple<long_double,_2UL>_> *)in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }